

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O2

void charls::transform_line<charls::transform_hp3<unsigned_char>::inverse,unsigned_char>
               (triplet<unsigned_char> *destination,triplet<unsigned_char> *source,
               size_t pixel_count,inverse *transform)

{
  triplet<unsigned_char> tVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0;
  while (bVar3 = pixel_count != 0, pixel_count = pixel_count - 1, bVar3) {
    tVar1 = transform_hp3<unsigned_char>::inverse::operator()
                      (transform,(uint)(&source->field_0)[lVar2].v1,
                       (uint)(&source->field_1)[lVar2].v2,(uint)(&source->field_2)[lVar2].v3);
    *(short *)(&destination->field_0 + lVar2) = tVar1._0_2_;
    (&destination->field_2)[lVar2].v3 = (uchar)tVar1.field_2;
    lVar2 = lVar2 + 3;
  }
  return;
}

Assistant:

void transform_line(triplet<PixelType>* destination, const triplet<PixelType>* source, const size_t pixel_count,
                    Transform& transform) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] = transform(source[i].v1, source[i].v2, source[i].v3);
    }
}